

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool operator==(TargetDependsClosureKey *lhs,TargetDependsClosureKey *rhs)

{
  __type _Var1;
  bool bVar2;
  
  if (lhs->Target != rhs->Target) {
    return false;
  }
  _Var1 = std::operator==(&lhs->Config,&rhs->Config);
  if (_Var1) {
    bVar2 = lhs->GenexOutput == rhs->GenexOutput;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(
  const cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey& lhs,
  const cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey& rhs)
{
  return lhs.Target == rhs.Target && lhs.Config == rhs.Config &&
    lhs.GenexOutput == rhs.GenexOutput;
}